

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pty.c
# Opt level: O0

Backend * pty_backend_create(Seat *seat,undefined8 param_2,Conf *conf,char **argv,long cmd,
                            byte param_6)

{
  _Bool _Var1;
  int iVar2;
  __pid_t _Var3;
  Conf *pCVar4;
  ssize_t sVar5;
  size_t sVar6;
  char *pcVar7;
  long lVar8;
  undefined8 *puVar9;
  undefined8 *puVar10;
  byte bVar11;
  char *in_stack_00000518;
  char *in_stack_00000520;
  undefined8 auStack_658 [161];
  undefined4 local_150;
  char *local_148;
  char *local_140;
  undefined8 *local_138;
  char *local_130;
  char *p_1;
  char *shellname;
  char *shell_1;
  char *shell;
  char *varval;
  char *val;
  char *key;
  char *term_env_var;
  char **p;
  int ptyfd;
  int i_1;
  char *value;
  char *name;
  char *pname;
  char *pcStack_c0;
  _Bool unset;
  char *e;
  char **ep;
  undefined1 local_a8 [4];
  int plen;
  termios attrs;
  int ret;
  int pos;
  int len;
  char *location;
  Pty *pPStack_50;
  int i;
  Pty *pty;
  pid_t pgrp;
  pid_t pid;
  int slavefd;
  _Bool pipes_instead_local;
  char *cmd_local;
  char **argv_local;
  Conf *conf_local;
  LogContext *logctx_local;
  Seat *seat_local;
  
  bVar11 = 0;
  local_138 = (undefined8 *)&stack0x00000008;
  param_6 = param_6 & 1;
  seat_set_trust_status(seat,false);
  if (single_pty == (Pty *)0x0) {
    pPStack_50 = new_pty_struct();
    pPStack_50->slave_fd = -1;
    pPStack_50->master_fd = -1;
    pty_stamped_utmp = false;
  }
  else {
    pPStack_50 = single_pty;
    if (single_pty->conf != (Conf *)0x0) {
      __assert_fail("pty->conf == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/unix/pty.c",
                    0x373,
                    "Backend *pty_backend_create(Seat *, LogContext *, Conf *, char **, const char *, struct ssh_ttymodes, _Bool, const char *, const char *const *)"
                   );
    }
  }
  for (location._4_4_ = 0; location._4_4_ < 6; location._4_4_ = location._4_4_ + 1) {
    pPStack_50->pipefds[location._4_4_] = -1;
  }
  for (location._4_4_ = 0; location._4_4_ < 3; location._4_4_ = location._4_4_ + 1) {
    pPStack_50->fds[location._4_4_].fd = -1;
    pPStack_50->fds[location._4_4_].pty = pPStack_50;
  }
  if (pty_signal_pipe[0] < 0) {
    iVar2 = pipe(pty_signal_pipe);
    if (iVar2 < 0) {
      perror("pipe");
      exit(1);
    }
    cloexec(pty_signal_pipe[0]);
    cloexec(pty_signal_pipe[1]);
  }
  pPStack_50->seat = seat;
  (pPStack_50->backend).vt = &pty_backend;
  pCVar4 = conf_copy(conf);
  pPStack_50->conf = pCVar4;
  iVar2 = conf_get_int(conf,0x7d);
  pPStack_50->term_width = iVar2;
  iVar2 = conf_get_int(conf,0x7e);
  pPStack_50->term_height = iVar2;
  if (ptyfds == (tree234 *)0x0) {
    ptyfds = newtree234(ptyfd_compare);
  }
  if (param_6 == 0) {
    if (pPStack_50->master_fd < 0) {
      pty_open_master(pPStack_50);
    }
    if (-1 < pty_utmp_helper_pipe) {
      _Var1 = conf_get_bool(conf,0xc4);
      if (_Var1) {
        pcVar7 = seat_get_x_display(pPStack_50->seat);
        sVar6 = strlen(pcVar7);
        iVar2 = (int)sVar6 + 1;
        for (attrs.c_ospeed = 0; (int)attrs.c_ospeed < iVar2;
            attrs.c_ospeed = attrs.c_ispeed + attrs.c_ospeed) {
          sVar5 = write(pty_utmp_helper_pipe,pcVar7 + (int)attrs.c_ospeed,
                        (long)(int)(iVar2 - attrs.c_ospeed));
          attrs.c_ispeed = (speed_t)sVar5;
          if ((int)attrs.c_ispeed < 0) {
            perror("pterm: writing to utmp helper process");
            close(pty_utmp_helper_pipe);
            pty_utmp_helper_pipe = -1;
            break;
          }
        }
      }
      else {
        close(pty_utmp_helper_pipe);
        pty_utmp_helper_pipe = -1;
      }
    }
    pPStack_50->master_i = pPStack_50->master_fd;
    pPStack_50->master_o = pPStack_50->master_fd;
    pPStack_50->master_e = -1;
    pPStack_50->fds[0].fd = pPStack_50->master_fd;
    add234(ptyfds,pPStack_50->fds);
  }
  else {
    if ((-1 < pPStack_50->master_fd) && (close(pPStack_50->master_fd), -1 < pty_utmp_helper_pipe)) {
      close(pty_utmp_helper_pipe);
      pty_utmp_helper_pipe = -1;
    }
    for (location._4_4_ = 0; location._4_4_ < 6; location._4_4_ = location._4_4_ + 2) {
      iVar2 = pipe(pPStack_50->pipefds + location._4_4_);
      if (iVar2 < 0) {
        backend_free(&pPStack_50->backend);
        return (Backend *)0x0;
      }
    }
    iVar2 = pPStack_50->pipefds[1];
    pPStack_50->master_i = iVar2;
    pPStack_50->fds[0].fd = iVar2;
    iVar2 = pPStack_50->pipefds[2];
    pPStack_50->master_o = iVar2;
    pPStack_50->fds[1].fd = iVar2;
    iVar2 = pPStack_50->pipefds[4];
    pPStack_50->master_e = iVar2;
    pPStack_50->fds[2].fd = iVar2;
    add234(ptyfds,pPStack_50->fds);
    add234(ptyfds,pPStack_50->fds + 1);
    add234(ptyfds,pPStack_50->fds + 2);
  }
  pty_setup_sigchld_handler();
  _Var3 = fork();
  if (_Var3 < 0) {
    perror("fork");
    exit(1);
  }
  if (_Var3 != 0) {
    pPStack_50->child_pid = _Var3;
    pPStack_50->child_dead = false;
    pPStack_50->finished = false;
    if (0 < pPStack_50->slave_fd) {
      close(pPStack_50->slave_fd);
    }
    if (ptys_by_pid == (tree234 *)0x0) {
      ptys_by_pid = newtree234(pty_compare_by_pid);
    }
    if (-1 < pPStack_50->pipefds[0]) {
      close(pPStack_50->pipefds[0]);
      pPStack_50->pipefds[0] = -1;
    }
    if (-1 < pPStack_50->pipefds[3]) {
      close(pPStack_50->pipefds[3]);
      pPStack_50->pipefds[3] = -1;
    }
    if (-1 < pPStack_50->pipefds[5]) {
      close(pPStack_50->pipefds[5]);
      pPStack_50->pipefds[5] = -1;
    }
    add234(ptys_by_pid,pPStack_50);
    pty_uxsel_setup(pPStack_50);
    return &pPStack_50->backend;
  }
  if (pty_osx_envrestore_prefix == (char *)0x0) {
LAB_00115fe9:
    _Var3 = getpid();
    if (param_6 == 0) {
      iVar2 = pty_open_slave(pPStack_50);
      if (iVar2 < 0) {
        perror("slave pty: open");
        _exit(1);
      }
      close(pPStack_50->master_fd);
      noncloexec(iVar2);
      dup2(iVar2,0);
      dup2(iVar2,1);
      dup2(iVar2,2);
      close(iVar2);
      setsid();
      ioctl(0,0x540e,1);
      tcsetpgrp(0,_Var3);
      iVar2 = tcgetattr(0,(termios *)local_a8);
      if (iVar2 == 0) {
        _Var1 = conf_get_bool(conf,0x48);
        attrs.c_cflag._3_1_ = 8;
        if (_Var1) {
          attrs.c_cflag._3_1_ = 0x7f;
        }
        _Var1 = seat_is_utf8(seat);
        if (_Var1) {
          local_a8 = (undefined1  [4])((uint)local_a8 | 0x4000);
        }
        else {
          local_a8 = (undefined1  [4])((uint)local_a8 & 0xffffbfff);
        }
        puVar9 = local_138;
        puVar10 = auStack_658;
        for (lVar8 = 0xa1; lVar8 != 0; lVar8 = lVar8 + -1) {
          *puVar10 = *puVar9;
          puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
          puVar10 = puVar10 + (ulong)bVar11 * -2 + 1;
        }
        local_150 = *(undefined4 *)(local_138 + 0xa1);
        copy_ttymodes_into_termios(local_a8);
        tcsetattr(0,0,(termios *)local_a8);
      }
    }
    else {
      dup2(pPStack_50->pipefds[0],0);
      dup2(pPStack_50->pipefds[3],1);
      dup2(pPStack_50->pipefds[5],2);
      for (p._4_4_ = 0; p._4_4_ < 6; p._4_4_ = p._4_4_ + 1) {
        close(pPStack_50->pipefds[p._4_4_]);
      }
      setsid();
    }
    setpgid(_Var3,_Var3);
    if ((param_6 == 0) && (p._0_4_ = open(pPStack_50->name,1,0), -1 < (int)p)) {
      close((int)p);
    }
    setpgid(_Var3,_Var3);
    pcVar7 = in_stack_00000520;
    if (in_stack_00000520 != (char *)0x0) {
      while (term_env_var = pcVar7, *(long *)term_env_var != 0) {
        unsetenv(*(char **)term_env_var);
        pcVar7 = term_env_var + 8;
      }
    }
    if (param_6 == 0) {
      pcVar7 = conf_get_str(conf,0x35);
      key = dupprintf("TERM=%s",pcVar7);
      putenv(key);
    }
    varval = conf_get_str_strs(conf,0x38,(char *)0x0,&val);
    while (varval != (char *)0x0) {
      shell = dupcat_fn(val,"=",varval,0);
      putenv(shell);
      varval = conf_get_str_strs(conf,0x38,val,&val);
    }
    if (in_stack_00000518 != (char *)0x0) {
      chdir(in_stack_00000518);
    }
    putty_signal(2,(_func_void_int *)0x0);
    putty_signal(3,(_func_void_int *)0x0);
    putty_signal(0xd,(_func_void_int *)0x0);
    block_signal(0xd,false);
    if ((argv == (char **)0x0) && (cmd == 0)) {
      shellname = getenv("SHELL");
      if (shellname == (char *)0x0) {
        shellname = "/bin/sh";
      }
      _Var1 = conf_get_bool(conf,0xc5);
      if (_Var1) {
        local_130 = strrchr(shellname,0x2f);
        sVar6 = strlen(shellname);
        p_1 = (char *)safemalloc(sVar6 + 2,1,0);
        if (local_130 == (char *)0x0) {
          local_148 = shellname;
        }
        else {
          local_148 = local_130 + 1;
        }
        local_130 = local_148;
        sprintf(p_1,"-%s",local_148);
      }
      else {
        p_1 = shellname;
      }
      execl(shellname,p_1,0);
    }
    else {
      if (argv != (char **)0x0) {
        execvp(*argv,argv);
      }
      if ((cmd != 0) && (shell_1 = getenv("SHELL"), shell_1 != (char *)0x0)) {
        execl(shell_1,shell_1,"-c",cmd,0);
      }
    }
    perror("exec");
    _exit(0x7f);
  }
  sVar6 = strlen(pty_osx_envrestore_prefix);
  ep._4_4_ = (int)sVar6;
  do {
    e = _environ;
    while( true ) {
      if (*(long *)e == 0) goto LAB_00115fe9;
      pcStack_c0 = *(char **)e;
      iVar2 = strncmp(pcStack_c0,pty_osx_envrestore_prefix,(long)ep._4_4_);
      if (iVar2 == 0) break;
      e = e + 8;
    }
    pname._7_1_ = pcStack_c0[ep._4_4_] == 'u';
    sVar6 = strcspn(pcStack_c0,"=");
    name = dupprintf("%.*s",sVar6 & 0xffffffff,pcStack_c0);
    value = name + (long)ep._4_4_ + 1;
    local_140 = pcStack_c0;
    sVar6 = strcspn(pcStack_c0,"=");
    _ptyfd = local_140 + sVar6;
    if (*_ptyfd != '\0') {
      _ptyfd = _ptyfd + 1;
    }
    _ptyfd = dupstr(_ptyfd);
    if ((pname._7_1_ & 1) == 0) {
      setenv(value,_ptyfd,1);
    }
    else {
      unsetenv(value);
    }
    unsetenv(name);
    safefree(name);
    safefree(_ptyfd);
  } while( true );
}

Assistant:

Backend *pty_backend_create(
    Seat *seat, LogContext *logctx, Conf *conf, char **argv, const char *cmd,
    struct ssh_ttymodes ttymodes, bool pipes_instead, const char *dir,
    const char *const *env_vars_to_unset)
{
    int slavefd;
    pid_t pid, pgrp;
#ifndef NOT_X_WINDOWS                  /* for Mac OS X native compilation */
    bool got_windowid;
    long windowid;
#endif
    Pty *pty;
    int i;

    /* No local authentication phase in this protocol */
    seat_set_trust_status(seat, false);

    if (single_pty) {
        pty = single_pty;
        assert(pty->conf == NULL);
    } else {
        pty = new_pty_struct();
        pty->master_fd = pty->slave_fd = -1;
#ifndef OMIT_UTMP
        pty_stamped_utmp = false;
#endif
    }
    for (i = 0; i < 6; i++)
        pty->pipefds[i] = -1;
    for (i = 0; i < 3; i++) {
        pty->fds[i].fd = -1;
        pty->fds[i].pty = pty;
    }

    if (pty_signal_pipe[0] < 0) {
        if (pipe(pty_signal_pipe) < 0) {
            perror("pipe");
            exit(1);
        }
        cloexec(pty_signal_pipe[0]);
        cloexec(pty_signal_pipe[1]);
    }

    pty->seat = seat;
    pty->backend.vt = &pty_backend;

    pty->conf = conf_copy(conf);
    pty->term_width = conf_get_int(conf, CONF_width);
    pty->term_height = conf_get_int(conf, CONF_height);

    if (!ptyfds)
        ptyfds = newtree234(ptyfd_compare);

    if (pipes_instead) {
        if (pty->master_fd >= 0) {
            /* If somehow we've got a pty master already and don't
             * need it, throw it away! */
            close(pty->master_fd);
#ifndef OMIT_UTMP
            if (pty_utmp_helper_pipe >= 0) {
                close(pty_utmp_helper_pipe); /* don't need this either */
                pty_utmp_helper_pipe = -1;
            }
#endif
        }


        for (i = 0; i < 6; i += 2) {
            if (pipe(pty->pipefds + i) < 0) {
                backend_free(&pty->backend);
                return NULL;
            }
        }

        pty->fds[0].fd = pty->master_i = pty->pipefds[1];
        pty->fds[1].fd = pty->master_o = pty->pipefds[2];
        pty->fds[2].fd = pty->master_e = pty->pipefds[4];

        add234(ptyfds, &pty->fds[0]);
        add234(ptyfds, &pty->fds[1]);
        add234(ptyfds, &pty->fds[2]);
    } else {
        if (pty->master_fd < 0)
            pty_open_master(pty);

#ifndef OMIT_UTMP
        /*
         * Stamp utmp (that is, tell the utmp helper process to do so),
         * or not.
         */
        if (pty_utmp_helper_pipe >= 0) {   /* if it's < 0, we can't anyway */
            if (!conf_get_bool(conf, CONF_stamp_utmp)) {
                /* We're not stamping utmp, so just let the child
                 * process die that was waiting to unstamp it later. */
                close(pty_utmp_helper_pipe);
                pty_utmp_helper_pipe = -1;
            } else {
                const char *location = seat_get_x_display(pty->seat);
                int len = strlen(location)+1, pos = 0; /* +1 to include NUL */
                while (pos < len) {
                    int ret = write(pty_utmp_helper_pipe,
                                    location + pos, len - pos);
                    if (ret < 0) {
                        perror("pterm: writing to utmp helper process");
                        close(pty_utmp_helper_pipe); /* arrgh, just give up */
                        pty_utmp_helper_pipe = -1;
                        break;
                    }
                    pos += ret;
                }
            }
        }
#endif

        pty->master_i = pty->master_fd;
        pty->master_o = pty->master_fd;
        pty->master_e = -1;

        pty->fds[0].fd = pty->master_fd;
        add234(ptyfds, &pty->fds[0]);
    }

#ifndef NOT_X_WINDOWS                  /* for Mac OS X native compilation */
    got_windowid = seat_get_windowid(pty->seat, &windowid);
#endif

    /*
     * Set up the signal handler to catch SIGCHLD, if pty_pre_init
     * didn't already do it.
     */
    pty_setup_sigchld_handler();

    /*
     * Fork and execute the command.
     */
    pid = fork();
    if (pid < 0) {
        perror("fork");
        exit(1);
    }

    if (pid == 0) {
        struct termios attrs;

        /*
         * We are the child.
         */

        if (pty_osx_envrestore_prefix) {
            int plen = strlen(pty_osx_envrestore_prefix);
            extern char **environ;
            char **ep;

          restart_osx_env_restore:
            for (ep = environ; *ep; ep++) {
                char *e = *ep;

                if (!strncmp(e, pty_osx_envrestore_prefix, plen)) {
                    bool unset = (e[plen] == 'u');
                    char *pname = dupprintf("%.*s", (int)strcspn(e, "="), e);
                    char *name = pname + plen + 1;
                    char *value = e + strcspn(e, "=");
                    if (*value) value++;
                    value = dupstr(value);
                    if (unset)
                        unsetenv(name);
                    else
                        setenv(name, value, 1);
                    unsetenv(pname);
                    sfree(pname);
                    sfree(value);
                    goto restart_osx_env_restore;
                }
            }
        }

        pgrp = getpid();

        if (pipes_instead) {
            int i;
            dup2(pty->pipefds[0], 0);
            dup2(pty->pipefds[3], 1);
            dup2(pty->pipefds[5], 2);
            for (i = 0; i < 6; i++)
                close(pty->pipefds[i]);

            setsid();
        } else {
            slavefd = pty_open_slave(pty);
            if (slavefd < 0) {
                perror("slave pty: open");
                _exit(1);
            }

            close(pty->master_fd);
            noncloexec(slavefd);
            dup2(slavefd, 0);
            dup2(slavefd, 1);
            dup2(slavefd, 2);
            close(slavefd);
            setsid();
#ifdef TIOCSCTTY
            ioctl(0, TIOCSCTTY, 1);
#endif
            tcsetpgrp(0, pgrp);

            /*
             * Set up configuration-dependent termios settings on the new
             * pty. Linux would have let us do this on the pty master
             * before we forked, but that fails on OS X, so we do it here
             * instead.
             */
            if (tcgetattr(0, &attrs) == 0) {
                /*
                 * Set the backspace character to be whichever of ^H and
                 * ^? is specified by bksp_is_delete.
                 */
                attrs.c_cc[VERASE] = conf_get_bool(conf, CONF_bksp_is_delete)
                    ? '\177' : '\010';

                /*
                 * Set the IUTF8 bit iff the character set is UTF-8.
                 */
#ifdef IUTF8
                if (seat_is_utf8(seat))
                    attrs.c_iflag |= IUTF8;
                else
                    attrs.c_iflag &= ~IUTF8;
#endif

                copy_ttymodes_into_termios(&attrs, ttymodes);

                tcsetattr(0, TCSANOW, &attrs);
            }
        }

        setpgid(pgrp, pgrp);
        if (!pipes_instead) {
            int ptyfd = open(pty->name, O_WRONLY, 0);
            if (ptyfd >= 0)
                close(ptyfd);
        }
        setpgid(pgrp, pgrp);

        if (env_vars_to_unset)
            for (const char *const *p = env_vars_to_unset; *p; p++)
                unsetenv(*p);

        if (!pipes_instead) {
            char *term_env_var = dupprintf("TERM=%s",
                                           conf_get_str(conf, CONF_termtype));
            putenv(term_env_var);
            /* We mustn't free term_env_var, as putenv links it into the
             * environment in place.
             */
        }
#ifndef NOT_X_WINDOWS                  /* for Mac OS X native compilation */
        if (got_windowid) {
            char *windowid_env_var = dupprintf("WINDOWID=%ld", windowid);
            putenv(windowid_env_var);
            /* We mustn't free windowid_env_var, as putenv links it into the
             * environment in place.
             */
        }
        {
            /*
             * In case we were invoked with a --display argument that
             * doesn't match DISPLAY in our actual environment, we
             * should set DISPLAY for processes running inside the
             * terminal to match the display the terminal itself is
             * on.
             */
            const char *x_display = seat_get_x_display(pty->seat);
            if (x_display) {
                char *x_display_env_var = dupprintf("DISPLAY=%s", x_display);
                putenv(x_display_env_var);
                /* As above, we don't free this. */
            } else {
                unsetenv("DISPLAY");
            }
        }
#endif
        {
            char *key, *val;

            for (val = conf_get_str_strs(conf, CONF_environmt, NULL, &key);
                 val != NULL;
                 val = conf_get_str_strs(conf, CONF_environmt, key, &key)) {
                char *varval = dupcat(key, "=", val);
                putenv(varval);
                /*
                 * We must not free varval, since putenv links it
                 * into the environment _in place_. Weird, but
                 * there we go. Memory usage will be rationalised
                 * as soon as we exec anyway.
                 */
            }
        }

        if (dir) {
            if (chdir(dir) < 0) {
                /* Ignore the error - nothing we can sensibly do about it,
                 * and our existing cwd is as good a fallback as any. */
            }
        }

        /*
         * SIGINT, SIGQUIT and SIGPIPE may have been set to ignored by
         * our parent, particularly by things like sh -c 'pterm &' and
         * some window or session managers. SIGPIPE was also
         * (potentially) blocked by us during startup. Reverse all
         * this for our child process.
         */
        putty_signal(SIGINT, SIG_DFL);
        putty_signal(SIGQUIT, SIG_DFL);
        putty_signal(SIGPIPE, SIG_DFL);
        block_signal(SIGPIPE, false);
        if (argv || cmd) {
            /*
             * If we were given a separated argument list, try to exec
             * it.
             */
            if (argv) {
                execvp(argv[0], argv);
            }
            /*
             * Otherwise, if we were given a single command string,
             * try passing that to $SHELL -c.
             *
             * In the case of pterm, this system of fallbacks arranges
             * that we can _either_ follow 'pterm -e' with a list of
             * argv elements to be fed directly to exec, _or_ with a
             * single argument containing a command to be parsed by a
             * shell (but, in cases of doubt, the former is more
             * reliable). We arrange this by setting argv to the full
             * argument list, and also setting cmd to the single
             * element of argv if it's a length-1 list.
             *
             * A quick survey of other terminal emulators' -e options
             * (as of Debian squeeze) suggests that:
             *
             *  - xterm supports both modes, more or less like this
             *  - gnome-terminal will only accept a one-string shell command
             *  - Eterm, kterm and rxvt will only accept a list of
             *    argv elements (as did older versions of pterm).
             *
             * It therefore seems important to support both usage
             * modes in order to be a drop-in replacement for either
             * xterm or gnome-terminal, and hence for anyone's
             * plausible uses of the Debian-style alias
             * 'x-terminal-emulator'.
             *
             * In other use cases, a caller can set only one of argv
             * and cmd to get a fixed handling of the input.
             */
            if (cmd) {
                char *shell = getenv("SHELL");
                if (shell)
                    execl(shell, shell, "-c", cmd, (void *)NULL);
            }
        } else {
            const char *shell = getenv("SHELL");
            if (!shell)
                shell = "/bin/sh";
            char *shellname;
            if (conf_get_bool(conf, CONF_login_shell)) {
                const char *p = strrchr(shell, '/');
                shellname = snewn(2+strlen(shell), char);
                p = p ? p+1 : shell;
                sprintf(shellname, "-%s", p);
            } else
                shellname = (char *)shell;
            execl(shell, shellname, (void *)NULL);
        }

        /*
         * If we're here, exec has gone badly foom.
         */
        perror("exec");
        _exit(127);
    } else {
        pty->child_pid = pid;
        pty->child_dead = false;
        pty->finished = false;
        if (pty->slave_fd > 0)
            close(pty->slave_fd);
        if (!ptys_by_pid)
            ptys_by_pid = newtree234(pty_compare_by_pid);
        if (pty->pipefds[0] >= 0) {
            close(pty->pipefds[0]);
            pty->pipefds[0] = -1;
        }
        if (pty->pipefds[3] >= 0) {
            close(pty->pipefds[3]);
            pty->pipefds[3] = -1;
        }
        if (pty->pipefds[5] >= 0) {
            close(pty->pipefds[5]);
            pty->pipefds[5] = -1;
        }
        add234(ptys_by_pid, pty);
    }

    pty_uxsel_setup(pty);

    return &pty->backend;
}